

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

bool __thiscall
CheaterBotStrategy::exchangeCountryOwnership
          (CheaterBotStrategy *this,Player *defendingPlayer,Country *toExchange)

{
  pointer *pppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Player *pPVar4;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  iterator __position;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  bool bVar6;
  ulong uVar7;
  pointer __src;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  ppCVar2 = (defendingPlayer->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (defendingPlayer->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppCVar3 - (long)ppCVar2 >> 3;
  if (ppCVar3 == ppCVar2) {
    iVar8 = -1;
  }
  else {
    iVar8 = -1;
    lVar9 = 0;
    do {
      if (*ppCVar2[lVar9]->cyID == *toExchange->cyID) {
        if (iVar8 != -1) goto LAB_0010b182;
        iVar8 = (int)lVar9;
      }
      lVar9 = lVar9 + 1;
    } while (uVar7 + (uVar7 == 0) != lVar9);
  }
  if (iVar8 == -1) {
LAB_0010b182:
    bVar6 = false;
  }
  else {
    pPVar4 = (this->super_PlayerStrategy).player;
    *toExchange->pPlayerOwnerId = *pPVar4->pPlayerId;
    uVar10 = (ulong)iVar8;
    if (uVar7 <= uVar10) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10)
      ;
    }
    this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)pPVar4->pOwnedCountries;
    __position._M_current = *(Country ***)(this_00 + 8);
    if (__position._M_current == *(Country ***)(this_00 + 0x10)) {
      std::vector<Map::Country*,std::allocator<Map::Country*>>::
      _M_realloc_insert<Map::Country*const&>(this_00,__position,ppCVar2 + uVar10);
    }
    else {
      *__position._M_current = ppCVar2[uVar10];
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    pvVar5 = defendingPlayer->pOwnedCountries;
    ppCVar2 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar3 = (pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    __src = ppCVar2 + uVar10 + 1;
    if (__src != ppCVar3) {
      memmove(ppCVar2 + uVar10,__src,(long)ppCVar3 - (long)__src);
    }
    pppCVar1 = &(pvVar5->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + -1;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool CheaterBotStrategy::exchangeCountryOwnership(Player* defendingPlayer, Map::Country* toExchange) {
    int toExchangeIndex = -1;

    for (int i = 0; i < defendingPlayer->getOwnedCountries()->size(); i++) {
        if (defendingPlayer->getOwnedCountries()->at(i)->getCountryId() == toExchange->getCountryId()) {
            if (toExchangeIndex != -1) {
                return false;
            }
            toExchangeIndex = i;
        }
    }

    if (toExchangeIndex == -1) {
        return false;
    }

    toExchange->setPlayerOwnerID(this->player->getPlayerId());
    this->player->getOwnedCountries()->push_back(defendingPlayer->getOwnedCountries()->at(toExchangeIndex));
    defendingPlayer->getOwnedCountries()->erase(defendingPlayer->getOwnedCountries()->begin() + toExchangeIndex);
    return true;
}